

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O3

void deqp::gls::setupDefaultUniforms(RenderContext *context,deUint32 programID)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  unkuint9 Var10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  bool bVar16;
  int iVar17;
  undefined4 extraout_var;
  bool bVar19;
  long lVar20;
  undefined1 auVar21 [15];
  undefined1 local_38 [16];
  long lVar18;
  
  iVar17 = (*context->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar17);
  lVar20 = 0;
  bVar16 = true;
  do {
    bVar19 = bVar16;
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,setupDefaultUniforms::s_boolUniforms[lVar20].name);
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x14f0))(iVar17,setupDefaultUniforms::s_boolUniforms[lVar20].value);
    }
    lVar20 = 1;
    bVar16 = false;
  } while (bVar19);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_bvec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  bVar16 = true;
  do {
    bVar19 = bVar16;
    auVar21._8_7_ = 0;
    auVar21._0_8_ = *(ulong *)&setupDefaultUniforms::s_bvec4Uniforms[lVar20].value;
    auVar21 = auVar21 & DAT_00639710._0_15_;
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar21._0_13_;
    auVar1[0xe] = auVar21[7];
    auVar3[0xc] = auVar21[6];
    auVar3._0_12_ = auVar21._0_12_;
    auVar3._13_2_ = auVar1._13_2_;
    auVar4[0xb] = 0;
    auVar4._0_11_ = auVar21._0_11_;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5[10] = auVar21[5];
    auVar5._0_10_ = auVar21._0_10_;
    auVar5._11_4_ = auVar4._11_4_;
    auVar6[9] = 0;
    auVar6._0_9_ = auVar21._0_9_;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = auVar21[4];
    auVar7._0_8_ = auVar21._0_8_;
    auVar7._9_6_ = auVar6._9_6_;
    auVar9._7_8_ = 0;
    auVar9._0_7_ = auVar7._8_7_;
    Var10 = CONCAT81(SUB158(auVar9 << 0x40,7),auVar21[3]);
    auVar14._9_6_ = 0;
    auVar14._0_9_ = Var10;
    auVar11._1_10_ = SUB1510(auVar14 << 0x30,5);
    auVar11[0] = auVar21[2];
    auVar15._11_4_ = 0;
    auVar15._0_11_ = auVar11;
    auVar12._1_12_ = SUB1512(auVar15 << 0x20,3);
    auVar12[0] = auVar21[1];
    local_38._0_2_ = CONCAT11(0,auVar21[0]);
    auVar8._2_13_ = auVar12;
    auVar8._0_2_ = local_38._0_2_;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar8._0_10_;
    auVar2._12_2_ = (short)Var10;
    auVar13._2_4_ = auVar2._10_4_;
    auVar13._0_2_ = auVar11._0_2_;
    auVar13._6_8_ = 0;
    local_38._6_8_ = SUB148(auVar13 << 0x40,6);
    local_38._4_2_ = auVar12._0_2_;
    local_38._2_2_ = 0;
    local_38._14_2_ = 0;
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,setupDefaultUniforms::s_bvec4Uniforms[lVar20].name);
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x15b8))(iVar17,1,local_38);
    }
    lVar20 = 1;
    bVar16 = false;
  } while (bVar19);
  lVar20 = 8;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)(&setupDefaultUniforms::s_boolUniforms[1].value + lVar20));
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x14f0))
                (iVar17,*(undefined4 *)((long)&setupDefaultUniforms::s_intUniforms[0].name + lVar20)
                );
    }
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0xb8);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec2Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&((IVec2Uniform *)
                                 (&setupDefaultUniforms::s_ivec2Uniforms[0].value + -1))->name +
                         lVar20));
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x1538))(iVar17,1,lVar20 + 0x78e0d8);
    }
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x60);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec3Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_ivec3Uniforms[0].value.m_data + lVar20 + -8)
                       );
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x1578))(iVar17,1,lVar20 + 0x78e148);
    }
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x90);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_ivec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_ivec4Uniforms[0].value.m_data + lVar20 + -8)
                       );
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x15b8))(iVar17,1,lVar20 + 0x78e1e8);
    }
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x90);
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&setupDefaultUniforms::s_floatUniforms[0].name + lVar20));
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x14e0))
                (*(undefined4 *)((long)&setupDefaultUniforms::s_floatUniforms[0].value + lVar20),
                 iVar17);
    }
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x100);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec2Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)&((Vec2Uniform *)
                                 (&setupDefaultUniforms::s_vec2Uniforms[0].value + -1))->name +
                         lVar20));
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x1528))(iVar17,1,lVar20 + 0x78e288);
    }
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x50);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec3Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_vec3Uniforms[0].value.m_data + lVar20 + -8))
    ;
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x1568))(iVar17,1,lVar20 + 0x78e2e8);
    }
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0x78);
  if (setupDefaultUniforms(glu::RenderContext_const&,unsigned_int)::s_vec4Uniforms == '\0') {
    setupDefaultUniforms();
  }
  lVar20 = 0;
  do {
    iVar17 = (**(code **)(lVar18 + 0xb48))
                       (programID,
                        *(undefined8 *)
                         ((long)setupDefaultUniforms::s_vec4Uniforms[0].value.m_data + lVar20 + -8))
    ;
    if (iVar17 != -1) {
      (**(code **)(lVar18 + 0x15a8))(iVar17,1,lVar20 + 0x78e368);
    }
    lVar20 = lVar20 + 0x18;
  } while (lVar20 != 0xc0);
  return;
}

Assistant:

void setupDefaultUniforms (const glu::RenderContext& context, deUint32 programID)
{
	const glw::Functions& gl = context.getFunctions();

	// Bool.
	struct BoolUniform { const char* name; bool value; };
	static const BoolUniform s_boolUniforms[] =
	{
		{ "ub_true",	true },
		{ "ub_false",	false },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_boolUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_boolUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_boolUniforms[i].value);
	}

	// BVec4.
	struct BVec4Uniform { const char* name; BVec4 value; };
	static const BVec4Uniform s_bvec4Uniforms[] =
	{
		{ "ub4_true",	BVec4(true) },
		{ "ub4_false",	BVec4(false) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_bvec4Uniforms); i++)
	{
		const BVec4Uniform& uni = s_bvec4Uniforms[i];
		int arr[4];
		arr[0] = (int)uni.value.x();
		arr[1] = (int)uni.value.y();
		arr[2] = (int)uni.value.z();
		arr[3] = (int)uni.value.w();
		int uniLoc = gl.getUniformLocation(programID, uni.name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, &arr[0]);
	}

	// Int.
	struct IntUniform { const char* name; int value; };
	static const IntUniform s_intUniforms[] =
	{
		{ "ui_minusOne",		-1 },
		{ "ui_zero",			0 },
		{ "ui_one",				1 },
		{ "ui_two",				2 },
		{ "ui_three",			3 },
		{ "ui_four",			4 },
		{ "ui_five",			5 },
		{ "ui_six",				6 },
		{ "ui_seven",			7 },
		{ "ui_eight",			8 },
		{ "ui_oneHundredOne",	101 }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_intUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_intUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1i(uniLoc, s_intUniforms[i].value);
	}

	// IVec2.
	struct IVec2Uniform { const char* name; IVec2 value; };
	static const IVec2Uniform s_ivec2Uniforms[] =
	{
		{ "ui2_minusOne",	IVec2(-1) },
		{ "ui2_zero",		IVec2(0) },
		{ "ui2_one",		IVec2(1) },
		{ "ui2_two",		IVec2(2) },
		{ "ui2_four",		IVec2(4) },
		{ "ui2_five",		IVec2(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2iv(uniLoc, 1, s_ivec2Uniforms[i].value.getPtr());
	}

	// IVec3.
	struct IVec3Uniform { const char* name; IVec3 value; };
	static const IVec3Uniform s_ivec3Uniforms[] =
	{
		{ "ui3_minusOne",	IVec3(-1) },
		{ "ui3_zero",		IVec3(0) },
		{ "ui3_one",		IVec3(1) },
		{ "ui3_two",		IVec3(2) },
		{ "ui3_four",		IVec3(4) },
		{ "ui3_five",		IVec3(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3iv(uniLoc, 1, s_ivec3Uniforms[i].value.getPtr());
	}

	// IVec4.
	struct IVec4Uniform { const char* name; IVec4 value; };
	static const IVec4Uniform s_ivec4Uniforms[] =
	{
		{ "ui4_minusOne",	IVec4(-1) },
		{ "ui4_zero",		IVec4(0) },
		{ "ui4_one",		IVec4(1) },
		{ "ui4_two",		IVec4(2) },
		{ "ui4_four",		IVec4(4) },
		{ "ui4_five",		IVec4(5) }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_ivec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_ivec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4iv(uniLoc, 1, s_ivec4Uniforms[i].value.getPtr());
	}

	// Float.
	struct FloatUniform { const char* name; float value; };
	static const FloatUniform s_floatUniforms[] =
	{
		{ "uf_zero",	0.0f },
		{ "uf_one",		1.0f },
		{ "uf_two",		2.0f },
		{ "uf_three",	3.0f },
		{ "uf_four",	4.0f },
		{ "uf_five",	5.0f },
		{ "uf_six",		6.0f },
		{ "uf_seven",	7.0f },
		{ "uf_eight",	8.0f },
		{ "uf_half",	1.0f / 2.0f },
		{ "uf_third",	1.0f / 3.0f },
		{ "uf_fourth",	1.0f / 4.0f },
		{ "uf_fifth",	1.0f / 5.0f },
		{ "uf_sixth",	1.0f / 6.0f },
		{ "uf_seventh",	1.0f / 7.0f },
		{ "uf_eighth",	1.0f / 8.0f }
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_floatUniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_floatUniforms[i].name);
		if (uniLoc != -1)
			gl.uniform1f(uniLoc, s_floatUniforms[i].value);
	}

	// Vec2.
	struct Vec2Uniform { const char* name; Vec2 value; };
	static const Vec2Uniform s_vec2Uniforms[] =
	{
		{ "uv2_minusOne",	Vec2(-1.0f) },
		{ "uv2_zero",		Vec2(0.0f) },
		{ "uv2_half",		Vec2(0.5f) },
		{ "uv2_one",		Vec2(1.0f) },
		{ "uv2_two",		Vec2(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec2Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec2Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform2fv(uniLoc, 1, s_vec2Uniforms[i].value.getPtr());
	}

	// Vec3.
	struct Vec3Uniform { const char* name; Vec3 value; };
	static const Vec3Uniform s_vec3Uniforms[] =
	{
		{ "uv3_minusOne",	Vec3(-1.0f) },
		{ "uv3_zero",		Vec3(0.0f) },
		{ "uv3_half",		Vec3(0.5f) },
		{ "uv3_one",		Vec3(1.0f) },
		{ "uv3_two",		Vec3(2.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec3Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec3Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform3fv(uniLoc, 1, s_vec3Uniforms[i].value.getPtr());
	}

	// Vec4.
	struct Vec4Uniform { const char* name; Vec4 value; };
	static const Vec4Uniform s_vec4Uniforms[] =
	{
		{ "uv4_minusOne",	Vec4(-1.0f) },
		{ "uv4_zero",		Vec4(0.0f) },
		{ "uv4_half",		Vec4(0.5f) },
		{ "uv4_one",		Vec4(1.0f) },
		{ "uv4_two",		Vec4(2.0f) },
		{ "uv4_black",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) },
		{ "uv4_gray",		Vec4(0.5f, 0.5f, 0.5f, 1.0f) },
		{ "uv4_white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
	};

	for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_vec4Uniforms); i++)
	{
		int uniLoc = gl.getUniformLocation(programID, s_vec4Uniforms[i].name);
		if (uniLoc != -1)
			gl.uniform4fv(uniLoc, 1, s_vec4Uniforms[i].value.getPtr());
	}
}